

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

wasm_func_t * wasm_func_new(wasm_store_t *store,wasm_functype_t *type,wasm_func_callback_t callback)

{
  ExternType *pEVar1;
  wasm_func_t *this;
  _func_void *p_Var2;
  FuncType wabt_type;
  anon_class_80_3_e2e6609b lambda;
  RefPtr<wabt::interp::HostFunc> local_158;
  RefPtr<wabt::interp::Func> local_138;
  FuncType local_120;
  undefined **local_e0;
  ExternKind local_d8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_d0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_b8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  wasm_store_t *local_80;
  undefined **local_78;
  ExternKind local_70;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_68;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_50;
  wasm_func_callback_t local_38;
  
  pEVar1 = (type->super_wasm_externtype_t).I._M_t.
           super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
           .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  if (pEVar1->kind == First) {
    local_d8 = First;
    local_e0 = &PTR__FuncType_00242880;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_d0,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pEVar1 + 1));
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_b8,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&pEVar1[2].kind);
    local_70 = local_d8;
    local_78 = &PTR__FuncType_00242880;
    local_80 = store;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_68,&local_d0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_50,&local_b8);
    local_38 = callback;
    this = (wasm_func_t *)operator_new(0x18);
    local_120.super_ExternType.kind = local_d8;
    local_120.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00242880;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_120.params,&local_d0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_120.results,&local_b8);
    local_a0._8_8_ = 0;
    p_Var2 = (_func_void *)operator_new(0x50);
    *(wasm_store_t **)p_Var2 = local_80;
    *(ExternKind *)(p_Var2 + 0x10) = local_70;
    *(undefined ***)(p_Var2 + 8) = &PTR__FuncType_00242880;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var2 + 0x18),&local_68);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var2 + 0x30),&local_50);
    *(wasm_func_callback_t *)(p_Var2 + 0x48) = local_38;
    local_88 = std::
               _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc:795:17)>
               ::_M_invoke;
    local_90 = std::
               _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc:795:17)>
               ::_M_manager;
    local_a0._M_unused._0_8_ = (undefined8)p_Var2;
    wabt::interp::Store::
    Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
              (&local_158,&store->I,&store->I,&local_120,
               (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
                *)&local_a0);
    local_138.obj_ = &(local_158.obj_)->super_Func;
    local_138.store_ = local_158.store_;
    if (local_158.store_ == (Store *)0x0) {
      local_138.root_index_ = 0;
    }
    else {
      local_138.root_index_ = wabt::interp::Store::CopyRoot(local_158.store_,local_158.root_index_);
    }
    wasm_func_t::wasm_func_t(this,&local_138);
    if ((HostFunc *)local_138.obj_ != (HostFunc *)0x0) {
      wabt::interp::Store::DeleteRoot(local_138.store_,local_138.root_index_);
      local_138.obj_ = (Func *)0x0;
      local_138.store_ = (Store *)0x0;
      local_138.root_index_ = 0;
    }
    if (local_158.obj_ != (HostFunc *)0x0) {
      wabt::interp::Store::DeleteRoot(local_158.store_,local_158.root_index_);
      local_158.obj_ = (HostFunc *)0x0;
      local_158.store_ = (Store *)0x0;
      local_158.root_index_ = 0;
    }
    if (local_90 != (code *)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
    local_120.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00242880;
    if (local_120.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_120.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_78 = &PTR__FuncType_00242880;
    if (local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_e0 = &PTR__FuncType_00242880;
    if (local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return this;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                ,0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
               );
}

Assistant:

own wasm_func_t* wasm_func_new(wasm_store_t* store,
                               const wasm_functype_t* type,
                               wasm_func_callback_t callback) {
  FuncType wabt_type = *type->As<FuncType>();
  auto lambda = [=](Thread& thread, const Values& wabt_params,
                    Values& wabt_results, Trap::Ptr* out_trap) -> Result {
    wasm_val_vec_t params, results;
    wasm_val_vec_new_uninitialized(&params, wabt_params.size());
    wasm_val_vec_new_uninitialized(&results, wabt_results.size());
    FromWabtValues(store->I, &params, wabt_type.params, wabt_params);
    auto trap = callback(&params, &results);
    wasm_val_vec_delete(&params);
    if (trap) {
      *out_trap = trap->I.As<Trap>();
      wasm_trap_delete(trap);
      // Can't use wasm_val_vec_delete since it wasn't populated.
      delete[] results.data;
      return Result::Error;
    }
    wabt_results = ToWabtValues(&results);
    wasm_val_vec_delete(&results);
    return Result::Ok;
  };

  return new wasm_func_t{HostFunc::New(store->I, wabt_type, lambda)};
}